

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

char * nifti_intent_string(int ii)

{
  switch(ii) {
  case 2:
    return "Correlation statistic";
  case 3:
    return "T-statistic";
  case 4:
    return "F-statistic";
  case 5:
    return "Z-score";
  case 6:
    return "Chi-squared distribution";
  case 7:
    return "Beta distribution";
  case 8:
    return "Binomial distribution";
  case 9:
    return "Gamma distribution";
  case 10:
    return "Poisson distribution";
  case 0xb:
    return "Normal distribution";
  case 0xc:
    return "F-statistic noncentral";
  case 0xd:
    return "Chi-squared noncentral";
  case 0xe:
    return "Logistic distribution";
  case 0xf:
    return "Laplace distribution";
  case 0x10:
    return "Uniform distribition";
  case 0x11:
    return "T-statistic noncentral";
  case 0x12:
    return "Weibull distribution";
  case 0x13:
    return "Chi distribution";
  case 0x14:
    return "Inverse Gaussian distribution";
  case 0x15:
    return "Extreme Value distribution";
  case 0x16:
    return "P-value";
  case 0x17:
    return "Log P-value";
  case 0x18:
    return "Log10 P-value";
  }
  switch(ii) {
  case 0x3e9:
    return "Estimate";
  case 0x3ea:
    return "Label index";
  case 0x3eb:
    return "NeuroNames index";
  case 0x3ec:
    return "General matrix";
  case 0x3ed:
    return "Symmetric matrix";
  case 0x3ee:
    return "Displacement vector";
  case 0x3ef:
    return "Vector";
  case 0x3f0:
    return "Pointset";
  case 0x3f1:
    return "Triangle";
  case 0x3f2:
    return "Quaternion";
  case 0x3f3:
    return "Dimensionless number";
  default:
    return "Unknown";
  }
}

Assistant:

char const *nifti_intent_string( int ii )
{
   switch( ii ){
     case NIFTI_INTENT_CORREL:     return "Correlation statistic" ;
     case NIFTI_INTENT_TTEST:      return "T-statistic" ;
     case NIFTI_INTENT_FTEST:      return "F-statistic" ;
     case NIFTI_INTENT_ZSCORE:     return "Z-score"     ;
     case NIFTI_INTENT_CHISQ:      return "Chi-squared distribution" ;
     case NIFTI_INTENT_BETA:       return "Beta distribution" ;
     case NIFTI_INTENT_BINOM:      return "Binomial distribution" ;
     case NIFTI_INTENT_GAMMA:      return "Gamma distribution" ;
     case NIFTI_INTENT_POISSON:    return "Poisson distribution" ;
     case NIFTI_INTENT_NORMAL:     return "Normal distribution" ;
     case NIFTI_INTENT_FTEST_NONC: return "F-statistic noncentral" ;
     case NIFTI_INTENT_CHISQ_NONC: return "Chi-squared noncentral" ;
     case NIFTI_INTENT_LOGISTIC:   return "Logistic distribution" ;
     case NIFTI_INTENT_LAPLACE:    return "Laplace distribution" ;
     case NIFTI_INTENT_UNIFORM:    return "Uniform distribition" ;
     case NIFTI_INTENT_TTEST_NONC: return "T-statistic noncentral" ;
     case NIFTI_INTENT_WEIBULL:    return "Weibull distribution" ;
     case NIFTI_INTENT_CHI:        return "Chi distribution" ;
     case NIFTI_INTENT_INVGAUSS:   return "Inverse Gaussian distribution" ;
     case NIFTI_INTENT_EXTVAL:     return "Extreme Value distribution" ;
     case NIFTI_INTENT_PVAL:       return "P-value" ;

     case NIFTI_INTENT_LOGPVAL:    return "Log P-value" ;
     case NIFTI_INTENT_LOG10PVAL:  return "Log10 P-value" ;

     case NIFTI_INTENT_ESTIMATE:   return "Estimate" ;
     case NIFTI_INTENT_LABEL:      return "Label index" ;
     case NIFTI_INTENT_NEURONAME:  return "NeuroNames index" ;
     case NIFTI_INTENT_GENMATRIX:  return "General matrix" ;
     case NIFTI_INTENT_SYMMATRIX:  return "Symmetric matrix" ;
     case NIFTI_INTENT_DISPVECT:   return "Displacement vector" ;
     case NIFTI_INTENT_VECTOR:     return "Vector" ;
     case NIFTI_INTENT_POINTSET:   return "Pointset" ;
     case NIFTI_INTENT_TRIANGLE:   return "Triangle" ;
     case NIFTI_INTENT_QUATERNION: return "Quaternion" ;

     case NIFTI_INTENT_DIMLESS:    return "Dimensionless number" ;
   }
   return "Unknown" ;
}